

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

sysbvm_context_t * sysbvm_context_createWithOptions(sysbvm_contextCreationOptions_t *contextOptions)

{
  uint32_t uVar1;
  sysbvm_context_t *context_00;
  sysbvm_pic_t *psVar2;
  char *pcVar3;
  sysbvm_tuple_t sVar4;
  byte local_21;
  sysbvm_context_t *context;
  sysbvm_contextCreationOptions_t *contextOptions_local;
  
  context_00 = (sysbvm_context_t *)calloc(1,0x2320);
  if (contextOptions->targetWordSize == 0) {
    uVar1 = 8;
  }
  else {
    uVar1 = contextOptions->targetWordSize;
  }
  context_00->targetWordSize = uVar1;
  context_00->identityHashSeed = 1;
  local_21 = 0;
  if ((sysbvm_context_default_jitEnabled & 1U) != 0) {
    local_21 = contextOptions->nojit ^ 0xff;
  }
  context_00->jitEnabled = (_Bool)(local_21 & 1);
  context_00->gcDisabled = contextOptions->gcType == 3;
  sysbvm_dynarray_initialize(&context_00->jittedObjectFileEntries,8,0x400);
  sysbvm_dynarray_initialize(&context_00->jittedRegisteredFrames,8,0x400);
  sysbvm_dynarray_initialize(&context_00->markingStack,8,0x100000);
  sysbvm_heap_initialize((sysbvm_heap_t *)context_00);
  psVar2 = (sysbvm_pic_t *)
           sysbvm_chunkedAllocator_allocate(&(context_00->heap).picTableAllocator,0x68,8);
  context_00->analyzeASTWithEnvironmentPIC = psVar2;
  psVar2 = (sysbvm_pic_t *)
           sysbvm_chunkedAllocator_allocate(&(context_00->heap).picTableAllocator,0x68,8);
  context_00->evaluateASTWithEnvironment = psVar2;
  psVar2 = (sysbvm_pic_t *)
           sysbvm_chunkedAllocator_allocate(&(context_00->heap).picTableAllocator,0x68,8);
  context_00->evaluateAndAnalyzeASTWithEnvironment = psVar2;
  sysbvm_gc_lock(context_00);
  sysbvm_context_createBasicTypes(context_00);
  if (contextOptions->buildArchitectureName == (char *)0x0) {
    pcVar3 = sysbvm_system_getArchitectureName();
    contextOptions->buildArchitectureName = pcVar3;
  }
  if (contextOptions->buildVendorName == (char *)0x0) {
    pcVar3 = sysbvm_system_getVendorName();
    contextOptions->buildVendorName = pcVar3;
  }
  if (contextOptions->buildOSName == (char *)0x0) {
    pcVar3 = sysbvm_system_getOSName();
    contextOptions->buildOSName = pcVar3;
  }
  if (contextOptions->buildAbiName == (char *)0x0) {
    pcVar3 = sysbvm_system_getAbiName();
    contextOptions->buildAbiName = pcVar3;
  }
  if (contextOptions->buildObjectFileName == (char *)0x0) {
    pcVar3 = sysbvm_system_getObjectFileName();
    contextOptions->buildObjectFileName = pcVar3;
  }
  if (contextOptions->buildDebugInformationFormatName == (char *)0x0) {
    pcVar3 = sysbvm_system_getDebugInformationFormatName();
    contextOptions->buildDebugInformationFormatName = pcVar3;
  }
  if (contextOptions->buildExceptionHandlingTableFormatName == (char *)0x0) {
    pcVar3 = sysbvm_system_getExceptionHandlingTableFormatName();
    contextOptions->buildExceptionHandlingTableFormatName = pcVar3;
  }
  if (contextOptions->hostArchitectureName == (char *)0x0) {
    contextOptions->hostArchitectureName = contextOptions->buildArchitectureName;
  }
  if (contextOptions->hostVendorName == (char *)0x0) {
    contextOptions->hostVendorName = contextOptions->buildVendorName;
  }
  if (contextOptions->hostOSName == (char *)0x0) {
    contextOptions->hostOSName = contextOptions->buildOSName;
  }
  if (contextOptions->hostAbiName == (char *)0x0) {
    contextOptions->hostAbiName = contextOptions->buildAbiName;
  }
  if (contextOptions->hostObjectFileName == (char *)0x0) {
    contextOptions->hostObjectFileName = contextOptions->buildObjectFileName;
  }
  if (contextOptions->hostDebugInformationFormatName == (char *)0x0) {
    contextOptions->hostDebugInformationFormatName = contextOptions->buildDebugInformationFormatName
    ;
  }
  if (contextOptions->hostExceptionHandlingTableFormatName == (char *)0x0) {
    contextOptions->hostExceptionHandlingTableFormatName =
         contextOptions->buildExceptionHandlingTableFormatName;
  }
  if (contextOptions->targetArchitectureName == (char *)0x0) {
    contextOptions->targetArchitectureName = contextOptions->hostArchitectureName;
  }
  if (contextOptions->targetVendorName == (char *)0x0) {
    contextOptions->targetVendorName = contextOptions->hostVendorName;
  }
  if (contextOptions->targetOSName == (char *)0x0) {
    contextOptions->targetOSName = contextOptions->hostOSName;
  }
  if (contextOptions->targetAbiName == (char *)0x0) {
    contextOptions->targetAbiName = contextOptions->hostAbiName;
  }
  if (contextOptions->targetObjectFileName == (char *)0x0) {
    contextOptions->targetObjectFileName = contextOptions->hostObjectFileName;
  }
  if (contextOptions->targetDebugInformationFormatName == (char *)0x0) {
    contextOptions->targetDebugInformationFormatName =
         contextOptions->hostDebugInformationFormatName;
  }
  if (contextOptions->targetExceptionHandlingTableFormatName == (char *)0x0) {
    contextOptions->targetExceptionHandlingTableFormatName =
         contextOptions->hostExceptionHandlingTableFormatName;
  }
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->buildArchitectureName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__BuildArchitecture__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->buildVendorName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__BuildVendor__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->buildOSName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__BuildOS__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->buildAbiName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__BuildAbi__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->buildObjectFileName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__BuildObjectFile__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString
                    (context_00,contextOptions->buildDebugInformationFormatName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context_00,"__BuildDebugInformationFormat__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString
                    (context_00,contextOptions->buildExceptionHandlingTableFormatName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context_00,"__BuildExceptionHandlingTableFormat__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->hostArchitectureName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__HostArchitecture__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->hostVendorName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__HostVendor__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->hostOSName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__HostOS__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->hostAbiName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__HostAbi__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->hostObjectFileName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__HostObjectFile__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->hostDebugInformationFormatName)
  ;
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context_00,"__HostDebugInformationFormat__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString
                    (context_00,contextOptions->hostExceptionHandlingTableFormatName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context_00,"__HostExceptionHandlingTableFormat__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->targetArchitectureName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__TargetArchitecture__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->targetVendorName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__TargetVendor__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->targetOSName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__TargetOS__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->targetAbiName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__TargetAbi__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString(context_00,contextOptions->targetObjectFileName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context_00,"__TargetObjectFile__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString
                    (context_00,contextOptions->targetDebugInformationFormatName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context_00,"__TargetDebugInformationFormat__",sVar4);
  sVar4 = sysbvm_symbol_internWithCString
                    (context_00,contextOptions->targetExceptionHandlingTableFormatName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context_00,"__TargetExceptionHandlingTableFormat__",sVar4);
  sysbvm_array_setupPrimitives(context_00);
  sysbvm_orderedCollection_setupPrimitives(context_00);
  sysbvm_astInterpreter_setupASTInterpreter(context_00);
  sysbvm_boolean_setupPrimitives(context_00);
  sysbvm_bytecode_setupPrimitives(context_00);
  sysbvm_functionBytecodeDirectCompiler_setupPrimitives(context_00);
  sysbvm_byteStream_setupPrimitives(context_00);
  sysbvm_dictionary_setupPrimitives(context_00);
  sysbvm_errors_setupPrimitives(context_00);
  sysbvm_environment_setupPrimitives(context_00);
  sysbvm_exceptions_setupPrimitives(context_00);
  sysbvm_filesystem_setupPrimitives(context_00);
  sysbvm_float_setupPrimitives(context_00);
  sysbvm_function_setupPrimitives(context_00);
  sysbvm_integer_setupPrimitives(context_00);
  sysbvm_io_setupPrimitives(context_00);
  sysbvm_primitiveInteger_setupPrimitives(context_00);
  sysbvm_programEntity_setupPrimitives(context_00);
  sysbvm_set_setupPrimitives(context_00);
  sysbvm_sourcePosition_setupPrimitives(context_00);
  sysbvm_string_setupPrimitives(context_00);
  sysbvm_stringStream_setupPrimitives(context_00);
  sysbvm_time_setupPrimitives(context_00);
  sysbvm_tuple_setupPrimitives(context_00);
  sysbvm_type_setupPrimitives(context_00);
  sysbvm_gc_unlock(context_00);
  return context_00;
}

Assistant:

SYSBVM_API sysbvm_context_t *sysbvm_context_createWithOptions(sysbvm_contextCreationOptions_t *contextOptions)
{
    sysbvm_context_t *context = (sysbvm_context_t*)calloc(1, sizeof(sysbvm_context_t));
    context->targetWordSize = contextOptions->targetWordSize ? contextOptions->targetWordSize : sizeof(void*);
    context->identityHashSeed = 1;
    context->jitEnabled = sysbvm_context_default_jitEnabled && !contextOptions->nojit;
    context->gcDisabled = contextOptions->gcType == SYSBVM_GC_TYPE_DISABLED;
    sysbvm_dynarray_initialize(&context->jittedObjectFileEntries, sizeof(sysbvm_gdb_jit_code_entry_t*), 1024);
    sysbvm_dynarray_initialize(&context->jittedRegisteredFrames, sizeof(void*), 1024);
    sysbvm_dynarray_initialize(&context->markingStack, sizeof(sysbvm_tuple_t), 1<<20);

    sysbvm_heap_initialize(&context->heap);
    context->analyzeASTWithEnvironmentPIC = (sysbvm_pic_t*)sysbvm_chunkedAllocator_allocate(&context->heap.picTableAllocator, sizeof(sysbvm_pic_t), sizeof(uintptr_t));
    context->evaluateASTWithEnvironment = (sysbvm_pic_t*)sysbvm_chunkedAllocator_allocate(&context->heap.picTableAllocator, sizeof(sysbvm_pic_t), sizeof(uintptr_t));
    context->evaluateAndAnalyzeASTWithEnvironment = (sysbvm_pic_t*)sysbvm_chunkedAllocator_allocate(&context->heap.picTableAllocator, sizeof(sysbvm_pic_t), sizeof(uintptr_t));
    sysbvm_gc_lock(context);

    sysbvm_context_createBasicTypes(context);

    {
        if(!contextOptions->buildArchitectureName)
            contextOptions->buildArchitectureName = sysbvm_system_getArchitectureName();
        if(!contextOptions->buildVendorName)
            contextOptions->buildVendorName = sysbvm_system_getVendorName();
        if(!contextOptions->buildOSName)
            contextOptions->buildOSName = sysbvm_system_getOSName();
        if(!contextOptions->buildAbiName)
            contextOptions->buildAbiName = sysbvm_system_getAbiName();
        if(!contextOptions->buildObjectFileName)
            contextOptions->buildObjectFileName = sysbvm_system_getObjectFileName();
        if(!contextOptions->buildDebugInformationFormatName)
            contextOptions->buildDebugInformationFormatName = sysbvm_system_getDebugInformationFormatName();
        if(!contextOptions->buildExceptionHandlingTableFormatName)
            contextOptions->buildExceptionHandlingTableFormatName = sysbvm_system_getExceptionHandlingTableFormatName();

        if(!contextOptions->hostArchitectureName)
            contextOptions->hostArchitectureName = contextOptions->buildArchitectureName;
        if(!contextOptions->hostVendorName)
            contextOptions->hostVendorName = contextOptions->buildVendorName;
        if(!contextOptions->hostOSName)
            contextOptions->hostOSName = contextOptions->buildOSName;
        if(!contextOptions->hostAbiName)
            contextOptions->hostAbiName = contextOptions->buildAbiName;
        if(!contextOptions->hostObjectFileName)
            contextOptions->hostObjectFileName = contextOptions->buildObjectFileName;
        if(!contextOptions->hostDebugInformationFormatName)
            contextOptions->hostDebugInformationFormatName = contextOptions->buildDebugInformationFormatName;
        if(!contextOptions->hostExceptionHandlingTableFormatName)
            contextOptions->hostExceptionHandlingTableFormatName = contextOptions->buildExceptionHandlingTableFormatName;

        if(!contextOptions->targetArchitectureName)
            contextOptions->targetArchitectureName = contextOptions->hostArchitectureName;
        if(!contextOptions->targetVendorName)
            contextOptions->targetVendorName = contextOptions->hostVendorName;
        if(!contextOptions->targetOSName)
            contextOptions->targetOSName = contextOptions->hostOSName;
        if(!contextOptions->targetAbiName)
            contextOptions->targetAbiName = contextOptions->hostAbiName;
        if(!contextOptions->targetObjectFileName)
            contextOptions->targetObjectFileName = contextOptions->hostObjectFileName;
        if(!contextOptions->targetDebugInformationFormatName)
            contextOptions->targetDebugInformationFormatName = contextOptions->hostDebugInformationFormatName;
        if(!contextOptions->targetExceptionHandlingTableFormatName)
            contextOptions->targetExceptionHandlingTableFormatName = contextOptions->hostExceptionHandlingTableFormatName;
        
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__BuildArchitecture__", sysbvm_symbol_internWithCString(context, contextOptions->buildArchitectureName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__BuildVendor__", sysbvm_symbol_internWithCString(context, contextOptions->buildVendorName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__BuildOS__", sysbvm_symbol_internWithCString(context, contextOptions->buildOSName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__BuildAbi__", sysbvm_symbol_internWithCString(context, contextOptions->buildAbiName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__BuildObjectFile__", sysbvm_symbol_internWithCString(context, contextOptions->buildObjectFileName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__BuildDebugInformationFormat__", sysbvm_symbol_internWithCString(context, contextOptions->buildDebugInformationFormatName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__BuildExceptionHandlingTableFormat__", sysbvm_symbol_internWithCString(context, contextOptions->buildExceptionHandlingTableFormatName));

        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__HostArchitecture__", sysbvm_symbol_internWithCString(context, contextOptions->hostArchitectureName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__HostVendor__", sysbvm_symbol_internWithCString(context, contextOptions->hostVendorName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__HostOS__", sysbvm_symbol_internWithCString(context, contextOptions->hostOSName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__HostAbi__", sysbvm_symbol_internWithCString(context, contextOptions->hostAbiName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__HostObjectFile__", sysbvm_symbol_internWithCString(context, contextOptions->hostObjectFileName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__HostDebugInformationFormat__", sysbvm_symbol_internWithCString(context, contextOptions->hostDebugInformationFormatName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__HostExceptionHandlingTableFormat__", sysbvm_symbol_internWithCString(context, contextOptions->hostExceptionHandlingTableFormatName));

        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__TargetArchitecture__", sysbvm_symbol_internWithCString(context, contextOptions->targetArchitectureName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__TargetVendor__", sysbvm_symbol_internWithCString(context, contextOptions->targetVendorName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__TargetOS__", sysbvm_symbol_internWithCString(context, contextOptions->targetOSName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__TargetAbi__", sysbvm_symbol_internWithCString(context, contextOptions->targetAbiName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__TargetObjectFile__", sysbvm_symbol_internWithCString(context, contextOptions->targetObjectFileName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__TargetDebugInformationFormat__", sysbvm_symbol_internWithCString(context, contextOptions->targetDebugInformationFormatName));
        sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "__TargetExceptionHandlingTableFormat__", sysbvm_symbol_internWithCString(context, contextOptions->targetExceptionHandlingTableFormatName));
    }
    
    sysbvm_array_setupPrimitives(context);
    sysbvm_orderedCollection_setupPrimitives(context);
    sysbvm_astInterpreter_setupASTInterpreter(context);
    sysbvm_boolean_setupPrimitives(context);
    sysbvm_bytecode_setupPrimitives(context);
    sysbvm_functionBytecodeDirectCompiler_setupPrimitives(context);
    sysbvm_byteStream_setupPrimitives(context);
    sysbvm_dictionary_setupPrimitives(context);
    sysbvm_errors_setupPrimitives(context);
    sysbvm_environment_setupPrimitives(context);
    sysbvm_exceptions_setupPrimitives(context);
    sysbvm_filesystem_setupPrimitives(context);
    sysbvm_float_setupPrimitives(context);
    sysbvm_function_setupPrimitives(context);
    sysbvm_integer_setupPrimitives(context);
    sysbvm_io_setupPrimitives(context);
    sysbvm_primitiveInteger_setupPrimitives(context);
    sysbvm_programEntity_setupPrimitives(context);
    sysbvm_set_setupPrimitives(context);
    sysbvm_sourcePosition_setupPrimitives(context);
    sysbvm_string_setupPrimitives(context);
    sysbvm_stringStream_setupPrimitives(context);
    sysbvm_time_setupPrimitives(context);
    sysbvm_tuple_setupPrimitives(context);
    sysbvm_type_setupPrimitives(context);
    
    sysbvm_gc_unlock(context);

    return context;
}